

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

void __thiscall
ear::Channel::Channel
          (Channel *this,string *name,PolarPosition polarPosition,
          optional<ear::PolarPosition> *polarPositionNominal,
          optional<std::pair<double,_double>_> *azimuthRange,
          optional<std::pair<double,_double>_> *elevationRange,bool isLfe)

{
  bool isLfe_local;
  optional<std::pair<double,_double>_> *elevationRange_local;
  optional<std::pair<double,_double>_> *azimuthRange_local;
  optional<ear::PolarPosition> *polarPositionNominal_local;
  string *name_local;
  Channel *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  (this->_polarPosition).distance = polarPosition.distance;
  (this->_polarPosition).azimuth = polarPosition.azimuth;
  (this->_polarPosition).elevation = polarPosition.elevation;
  boost::optional<ear::PolarPosition>::optional(&this->_polarPositionNominal,polarPositionNominal);
  boost::optional<std::pair<double,_double>_>::optional(&this->_azimuthRange,azimuthRange);
  boost::optional<std::pair<double,_double>_>::optional(&this->_elevationRange,elevationRange);
  this->_isLfe = isLfe;
  return;
}

Assistant:

Channel::Channel(const std::string& name, PolarPosition polarPosition,
                   boost::optional<PolarPosition> polarPositionNominal,
                   boost::optional<std::pair<double, double>> azimuthRange,
                   boost::optional<std::pair<double, double>> elevationRange,
                   bool isLfe)
      : _name(name),
        _polarPosition(polarPosition),
        _polarPositionNominal(polarPositionNominal),
        _azimuthRange(azimuthRange),
        _elevationRange(elevationRange),
        _isLfe(isLfe){}